

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsubcmesh.cpp
# Opt level: O0

void __thiscall TPZSubCompMesh::TPZSubCompMesh(TPZSubCompMesh *this,TPZCompMesh *mesh)

{
  TPZStack<int,_10> *pTVar1;
  int dim;
  TPZCompMesh *in_RSI;
  TPZCompMesh *in_RDI;
  bool in_stack_0000004f;
  TPZGeoMesh *in_stack_00000050;
  void **in_stack_00000058;
  TPZCompMesh *in_stack_00000060;
  TPZGeoEl *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  void **in_stack_ffffffffffffffa8;
  TPZLinearAnalysis *rval;
  TPZCompEl *in_stack_ffffffffffffffb0;
  TPZManVector<long,_10> *this_00;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZSubCompMesh>((TPZRegisterClassId *)in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_024e3818);
  TPZCompMesh::Reference(in_RSI);
  TPZCompMesh::TPZCompMesh(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004f);
  TPZCompEl::TPZCompEl
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
             (TPZCompMesh *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  *(undefined ***)in_RDI = &PTR__TPZSubCompMesh_024e3388;
  *(undefined ***)in_RDI = &PTR__TPZSubCompMesh_024e3388;
  *(undefined ***)(in_RDI + 1) = &PTR__TPZSubCompMesh_024e3598;
  TPZAutoPointer<TPZLinearAnalysis>::TPZAutoPointer
            ((TPZAutoPointer<TPZLinearAnalysis> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  this_00 = (TPZManVector<long,_10> *)&in_RDI[1].fName.field_2;
  TPZManVector<long,_10>::TPZManVector(this_00,(int64_t)in_stack_ffffffffffffffa8);
  rval = (TPZLinearAnalysis *)
         (in_RDI[1].fElementVec.super_TPZChunkVector<TPZCompEl_*,_10>.fVec.fExtAlloc + 6);
  TPZManVector<long,_10>::TPZManVector(this_00,(int64_t)rval);
  std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::map
            ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             0x1aa283b);
  pTVar1 = &in_RDI[1].fElementVec.fFree;
  (pTVar1->super_TPZManVector<int,_10>).fExtAlloc[4] = -1;
  (pTVar1->super_TPZManVector<int,_10>).fExtAlloc[5] = -1;
  std::__cxx11::list<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::list
            ((list<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *)0x1aa285c);
  dim = TPZCompMesh::Dimension(in_RSI);
  TPZCompMesh::SetDimModel(in_RDI,dim);
  TPZAutoPointer<TPZLinearAnalysis>::operator=((TPZAutoPointer<TPZLinearAnalysis> *)this_00,rval);
  return;
}

Assistant:

TPZSubCompMesh::TPZSubCompMesh(TPZCompMesh &mesh) : TPZRegisterClassId(&TPZSubCompMesh::ClassId), TPZCompMesh(mesh.Reference()), TPZCompEl(mesh,0),
fSingularConnect(-1) {
    SetDimModel(mesh.Dimension());
	fAnalysis = NULL;
	
}